

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ErfLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_erf(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x316) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x316;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.erf_ = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ErfLayerParams>
                           (arena);
    (this->layer_).erf_ = (ErfLayerParams *)LVar2;
  }
  return (ErfLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::ErfLayerParams* NeuralNetworkLayer::_internal_mutable_erf() {
  if (!_internal_has_erf()) {
    clear_layer();
    set_has_erf();
    layer_.erf_ = CreateMaybeMessage< ::CoreML::Specification::ErfLayerParams >(GetArenaForAllocation());
  }
  return layer_.erf_;
}